

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

void tty_update_char(EditLine *el,wchar_t mode,wchar_t c)

{
  uchar uVar1;
  
  if ((((el->el_tty).t_t[(uint)mode][4].t_setmask >> (c & 0x1fU) & 1) == 0) &&
     (uVar1 = (el->el_tty).t_c[2][c], uVar1 != (el->el_tty).t_c[0][c])) {
    (el->el_tty).t_c[(uint)mode][c] = uVar1;
  }
  if (((el->el_tty).t_t[(uint)mode][4].t_clrmask & 1 << ((byte)c & 0x1f)) != 0) {
    (el->el_tty).t_c[(uint)mode][c] = (el->el_tty).t_vdisable;
  }
  return;
}

Assistant:

static void
tty_update_char(EditLine *el, int mode, int c) {
	if (!((el->el_tty.t_t[mode][MD_CHAR].t_setmask & C_SH(c)))
	    && (el->el_tty.t_c[TS_IO][c] != el->el_tty.t_c[EX_IO][c]))
		el->el_tty.t_c[mode][c] = el->el_tty.t_c[TS_IO][c];
	if (el->el_tty.t_t[mode][MD_CHAR].t_clrmask & C_SH(c))
		el->el_tty.t_c[mode][c] = el->el_tty.t_vdisable;
}